

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qp.c
# Opt level: O0

void validate_qp(char *file_src,char *file_tmp,char *file_res,int mode,int rm_tmp_file)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *clean;
  char *res;
  char *so;
  char *si;
  char *fname;
  FILE *f2;
  FILE *f1_out_in;
  FILE *f1_out;
  FILE *f1;
  char local_128 [5];
  char lt [3];
  char line [250];
  int rm_tmp_file_local;
  int mode_local;
  char *file_res_local;
  char *file_tmp_local;
  char *file_src_local;
  
  f1._5_2_ = 0xa0d;
  f1._7_1_ = 0;
  f1_out = (FILE *)0x0;
  f1_out_in = (FILE *)0x0;
  f2 = (FILE *)0x0;
  fname = (char *)0x0;
  si = (char *)0x0;
  so = (char *)0x0;
  res = (char *)0x0;
  clean = (char *)0x0;
  asprintf(&si,"%s/%s","samples",file_src);
  f1_out = (FILE *)fopen(si,"r");
  while (pcVar2 = fgets(local_128,0xfa,(FILE *)f1_out), pcVar2 != (char *)0x0) {
    uVar3 = cmime_string_chomp(local_128);
    if (mode == 1) {
      so = (char *)cmime_qp_encode(uVar3,(long)&f1 + 5);
    }
    else {
      so = (char *)cmime_qp_decode_text(uVar3);
    }
  }
  fclose((FILE *)f1_out);
  free(si);
  asprintf(&si,"%s/%s","samples",file_tmp);
  f1_out_in = (FILE *)fopen(si,"w");
  if ((FILE *)f1_out_in != (FILE *)0x0) {
    fprintf((FILE *)f1_out_in,"%s",so);
    fclose((FILE *)f1_out_in);
  }
  free(so);
  f2 = (FILE *)fopen(si,"r");
  while (pcVar2 = fgets(local_128,0xfa,(FILE *)f2), pcVar2 != (char *)0x0) {
    res = (char *)cmime_string_chomp(local_128);
  }
  fclose((FILE *)f2);
  if (rm_tmp_file == 1) {
    remove(si);
  }
  free(si);
  asprintf(&si,"%s/%s","samples",file_res);
  fname = (char *)fopen(si,"r");
  while (pcVar2 = fgets(local_128,0xfa,(FILE *)fname), pcVar2 != (char *)0x0) {
    clean = (char *)cmime_string_chomp(local_128);
  }
  fclose((FILE *)fname);
  free(si);
  iVar1 = strcmp(res,clean);
  if (iVar1 != 0) {
    __assert_fail("strcmp(so,res)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_qp.c"
                  ,0x5b,"void validate_qp(char *, char *, char *, int, int)");
  }
  return;
}

Assistant:

void validate_qp(char *file_src, char *file_tmp, char *file_res, int mode, int rm_tmp_file) {
    
    char line[250];
    char lt[]="\r\n";
    FILE *f1 = NULL;
    FILE *f1_out = NULL;
    FILE *f1_out_in = NULL;
    FILE *f2 = NULL;
    char *fname = NULL;
    char *si = NULL; 
    char *so = NULL;
    char *res = NULL;

    asprintf(&fname,"%s/%s",SAMPLES_DIR,file_src);
    f1 = fopen(fname, "r");
    while(fgets(line, 250, f1)) {
        char *clean;
        clean = cmime_string_chomp(line);
        if(mode == 1) {
            si = cmime_qp_encode(clean, lt);
        } else {
            si = cmime_qp_decode_text(clean);
        }
    }
    fclose(f1);
    free(fname);
    // write the encoded string to the temporary output file
    asprintf(&fname,"%s/%s",SAMPLES_DIR,file_tmp);
    f1_out = fopen (fname, "w");
    if (f1_out != NULL) { 
        fprintf(f1_out,"%s",si);
        fclose(f1_out);
    }
    free(si);
    // read it out again
    f1_out_in = fopen(fname, "r");
    while(fgets(line, 250, f1_out_in)) {
        so = cmime_string_chomp(line);
    }
    fclose(f1_out_in);
    if(rm_tmp_file == 1) remove(fname);
    free(fname);
    // now open the file that contains the result string
    asprintf(&fname,"%s/%s",SAMPLES_DIR,file_res);
    f2 = fopen(fname, "r");
    while(fgets(line, 250, f2)) {
        res = cmime_string_chomp(line);
    }
    fclose(f2);
    free(fname);
    // comparison
    assert(strcmp(so,res)==0);
}